

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QtPromise::QPromiseContextException>
          (PromiseError *this,QPromiseContextException *value)

{
  QPromiseContextException *this_00;
  QPromiseContextException *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (QPromiseContextException *)__cxa_allocate_exception(8);
  QtPromise::QPromiseContextException::QPromiseContextException(this_00,value);
  __cxa_throw(this_00,&QtPromise::QPromiseContextException::typeinfo,
              QtPromise::QPromiseContextException::~QPromiseContextException);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }